

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerAcquireMapPage(Pager *pPager,Pgno pgno,void *pData,PgHdr **ppPage)

{
  PgHdr *local_38;
  PgHdr *p;
  PgHdr **ppPage_local;
  void *pData_local;
  Pgno pgno_local;
  Pager *pPager_local;
  
  if (pPager->pMmapFreelist == (PgHdr *)0x0) {
    local_38 = (PgHdr *)sqlite3MallocZero((ulong)pPager->nExtra + 0x48);
    *ppPage = local_38;
    if (local_38 == (PgHdr *)0x0) {
      sqlite3OsUnfetch(pPager->fd,(ulong)(pgno - 1) * pPager->pageSize,pData);
      return 7;
    }
    local_38->pExtra = local_38 + 1;
    local_38->flags = 0x20;
    local_38->nRef = 1;
    local_38->pPager = pPager;
  }
  else {
    local_38 = pPager->pMmapFreelist;
    *ppPage = local_38;
    pPager->pMmapFreelist = local_38->pDirty;
    local_38->pDirty = (PgHdr *)0x0;
    memset(local_38->pExtra,0,8);
  }
  local_38->pgno = pgno;
  local_38->pData = pData;
  pPager->nMmapOut = pPager->nMmapOut + 1;
  return 0;
}

Assistant:

static int pagerAcquireMapPage(
  Pager *pPager,                  /* Pager object */
  Pgno pgno,                      /* Page number */
  void *pData,                    /* xFetch()'d data for this page */
  PgHdr **ppPage                  /* OUT: Acquired page object */
){
  PgHdr *p;                       /* Memory mapped page to return */

  if( pPager->pMmapFreelist ){
    *ppPage = p = pPager->pMmapFreelist;
    pPager->pMmapFreelist = p->pDirty;
    p->pDirty = 0;
    assert( pPager->nExtra>=8 );
    memset(p->pExtra, 0, 8);
  }else{
    *ppPage = p = (PgHdr *)sqlite3MallocZero(sizeof(PgHdr) + pPager->nExtra);
    if( p==0 ){
      sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1) * pPager->pageSize, pData);
      return SQLITE_NOMEM_BKPT;
    }
    p->pExtra = (void *)&p[1];
    p->flags = PGHDR_MMAP;
    p->nRef = 1;
    p->pPager = pPager;
  }

  assert( p->pExtra==(void *)&p[1] );
  assert( p->pPage==0 );
  assert( p->flags==PGHDR_MMAP );
  assert( p->pPager==pPager );
  assert( p->nRef==1 );

  p->pgno = pgno;
  p->pData = pData;
  pPager->nMmapOut++;

  return SQLITE_OK;
}